

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O0

void Qentem::TestOutPut::
     Print<char_const*,char[2],unsigned_long,char[10],char_const*,char[9],char16_t[36],char[19],Qentem::StringStream<char16_t>,char[4]>
               (char **values,char (*values_1) [2],unsigned_long *values_2,char (*values_3) [10],
               char **values_4,char (*values_5) [9],char16_t (*values_6) [36],char (*values_7) [19],
               StringStream<char16_t> *values_8,char (*values_9) [4])

{
  wstringstream **ppwVar1;
  wostream *pwVar2;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar3;
  char (*values_local_5) [9];
  char **values_local_4;
  char (*values_local_3) [10];
  unsigned_long *values_local_2;
  char (*values_local_1) [2];
  char **values_local;
  
  ppwVar1 = GetStreamCache_abi_cxx11_();
  if (*ppwVar1 == (wstringstream *)0x0) {
    pwVar2 = std::operator<<((wostream *)&std::wcout,*values);
    pwVar2 = std::operator<<(pwVar2,*values_1);
    pwVar2 = (wostream *)std::wostream::operator<<(pwVar2,*values_2);
    pwVar2 = std::operator<<(pwVar2,*values_3);
    pwVar2 = std::operator<<(pwVar2,*values_4);
    pwVar2 = std::operator<<(pwVar2,*values_5);
    pwVar2 = (wostream *)std::wostream::operator<<(pwVar2,values_6);
    pwVar2 = std::operator<<(pwVar2,*values_7);
    pbVar3 = operator<<((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)pwVar2,values_8);
    std::operator<<((wostream *)pbVar3,*values_9);
  }
  else {
    ppwVar1 = GetStreamCache_abi_cxx11_();
    pwVar2 = std::operator<<((wostream *)(*ppwVar1 + 0x10),*values);
    pwVar2 = std::operator<<(pwVar2,*values_1);
    pwVar2 = (wostream *)std::wostream::operator<<(pwVar2,*values_2);
    pwVar2 = std::operator<<(pwVar2,*values_3);
    pwVar2 = std::operator<<(pwVar2,*values_4);
    pwVar2 = std::operator<<(pwVar2,*values_5);
    pwVar2 = (wostream *)std::wostream::operator<<(pwVar2,values_6);
    pwVar2 = std::operator<<(pwVar2,*values_7);
    pbVar3 = operator<<((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)pwVar2,values_8);
    std::operator<<((wostream *)pbVar3,*values_9);
  }
  return;
}

Assistant:

inline static void Print(const Values_T &...values) {
        if (GetStreamCache() == nullptr) {
#if __cplusplus > 201402L
            (std::wcout << ... << values);
#else
            const int dummy[sizeof...(Values_T)] = {(std::wcout << values, 0)...};
            (void)dummy;
#endif

        } else {
#if __cplusplus > 201402L
            ((*GetStreamCache()) << ... << values);
#else
            const int dummy[sizeof...(Values_T)] = {((*GetStreamCache()) << values, 0)...};
            (void)dummy;
#endif
        }
    }